

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O1

void __thiscall
t_netstd_generator::t_netstd_generator
          (t_netstd_generator *this,t_program *program,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *parsed_options,string *option_string)

{
  _Rb_tree_node_base *__rhs;
  int iVar1;
  _Base_ptr p_Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  _Rb_tree_header *p_Var3;
  
  t_generator::t_generator((t_generator *)this,program);
  (this->super_t_oop_generator).super_t_generator._vptr_t_generator =
       (_func_int **)&PTR__t_netstd_generator_00410f68;
  (this->namespace_name_)._M_dataplus._M_p = (pointer)&(this->namespace_name_).field_2;
  (this->namespace_name_)._M_string_length = 0;
  (this->namespace_name_).field_2._M_local_buf[0] = '\0';
  (this->namespace_dir_)._M_dataplus._M_p = (pointer)&(this->namespace_dir_).field_2;
  (this->namespace_dir_)._M_string_length = 0;
  (this->namespace_dir_).field_2._M_local_buf[0] = '\0';
  (this->wcf_namespace_)._M_dataplus._M_p = (pointer)&(this->wcf_namespace_).field_2;
  (this->wcf_namespace_)._M_string_length = 0;
  (this->wcf_namespace_).field_2._M_local_buf[0] = '\0';
  p_Var3 = &(this->netstd_keywords)._M_t._M_impl.super__Rb_tree_header;
  (this->netstd_keywords)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->netstd_keywords)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->netstd_keywords)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->netstd_keywords)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header
  ;
  p_Var3 = &(this->collected_extension_types)._M_t._M_impl.super__Rb_tree_header;
  (this->collected_extension_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->collected_extension_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->netstd_keywords)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->member_mapping_scopes).
  super__Vector_base<t_netstd_generator::member_mapping_scope,_std::allocator<t_netstd_generator::member_mapping_scope>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->member_mapping_scopes).
  super__Vector_base<t_netstd_generator::member_mapping_scope,_std::allocator<t_netstd_generator::member_mapping_scope>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->member_mapping_scopes).
  super__Vector_base<t_netstd_generator::member_mapping_scope,_std::allocator<t_netstd_generator::member_mapping_scope>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->collected_extension_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var3->_M_header;
  (this->collected_extension_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var3->_M_header;
  (this->collected_extension_types)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = &(this->checked_extension_types)._M_t._M_impl.super__Rb_tree_header;
  (this->checked_extension_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->checked_extension_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->checked_extension_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var3->_M_header;
  (this->checked_extension_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var3->_M_header;
  (this->checked_extension_types)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->union_ = false;
  this->serialize_ = false;
  this->wcf_ = false;
  this->use_pascal_case_properties = false;
  this->suppress_deepcopy = false;
  this->add_async_postfix = false;
  p_Var2 = (parsed_options->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(parsed_options->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      __rhs = p_Var2 + 1;
      iVar1 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar1 == 0) {
        this->union_ = true;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)__rhs);
        if (iVar1 == 0) {
          this->serialize_ = true;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)__rhs);
          if (iVar1 != 0) {
            iVar1 = std::__cxx11::string::compare((char *)__rhs);
            if (iVar1 == 0) {
              this->use_pascal_case_properties = true;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)__rhs);
              if (iVar1 == 0) {
                this->suppress_deepcopy = true;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)__rhs);
                if (iVar1 != 0) {
                  __return_storage_ptr__ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __cxa_allocate_exception(0x20);
                  std::operator+(__return_storage_ptr__,"unknown option netstd:",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__rhs);
                  __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                              std::__cxx11::string::~string);
                }
                this->add_async_postfix = true;
              }
            }
            goto LAB_002b382e;
          }
          this->wcf_ = true;
        }
        std::__cxx11::string::_M_assign((string *)&this->wcf_namespace_);
      }
LAB_002b382e:
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_t_oop_generator).super_t_generator.out_dir_base_,0,
             (char *)(this->super_t_oop_generator).super_t_generator.out_dir_base_._M_string_length,
             0x39c5bf);
  return;
}

Assistant:

t_netstd_generator::t_netstd_generator(t_program* program, const map<string, string>& parsed_options, const string& option_string)
    : t_oop_generator(program)
{
    (void)option_string;
    suppress_deepcopy = false;
    add_async_postfix = false;
    use_pascal_case_properties = false;
    union_ = false;
    serialize_ = false;
    wcf_ = false;

    wcf_namespace_.clear();

    map<string, string>::const_iterator iter;

    for (iter = parsed_options.begin(); iter != parsed_options.end(); ++iter)
    {
        if (iter->first.compare("union") == 0) {
            union_ = true;
        }
        else if (iter->first.compare("serial") == 0) {
            serialize_ = true;
            wcf_namespace_ = iter->second; // since there can be only one namespace
        }
        else if (iter->first.compare("wcf") == 0) {
            wcf_ = true;
            wcf_namespace_ = iter->second;
        }
        else if (iter->first.compare("pascal") == 0) {
          use_pascal_case_properties = true;
        }
        else if (iter->first.compare("no_deepcopy") == 0) {
          suppress_deepcopy = true;
        }
        else if (iter->first.compare("async_postfix") == 0) {
          add_async_postfix = true;
        }
        else {
          throw "unknown option netstd:" + iter->first;
        }
    }

    out_dir_base_ = "gen-netstd";
}